

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaParser::ReadEmbeddedTextures(ColladaParser *this,ZipArchiveIOSystem *zip_archive)

{
  _Base_ptr *this_00;
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type __new_size;
  undefined8 uVar4;
  _Rb_tree_node_base *p_Var5;
  string local_50;
  long *plVar3;
  
  for (p_Var5 = (this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if (*(_Base_ptr *)(p_Var5 + 3) == p_Var5[3]._M_parent) {
      iVar2 = (*(zip_archive->super_IOSystem)._vptr_IOSystem[4])
                        (zip_archive,*(undefined8 *)(p_Var5 + 2),"rb");
      plVar3 = (long *)CONCAT44(extraout_var,iVar2);
      if (plVar3 != (long *)0x0) {
        __new_size = (**(code **)(*plVar3 + 0x30))(plVar3);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var5 + 3),__new_size)
        ;
        uVar1 = *(undefined8 *)(p_Var5 + 3);
        uVar4 = (**(code **)(*plVar3 + 0x30))(plVar3);
        (**(code **)(*plVar3 + 0x10))(plVar3,uVar1,uVar4,1);
        BaseImporter::GetExtension(&local_50,(string *)(p_Var5 + 2));
        this_00 = &p_Var5[3]._M_right;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        iVar2 = std::__cxx11::string::compare((char *)this_00);
        if (iVar2 == 0) {
          std::__cxx11::string::_M_replace((ulong)this_00,0,*(char **)(p_Var5 + 4),0x6b2f2d);
        }
        (**(code **)(*plVar3 + 8))(plVar3);
      }
    }
  }
  return;
}

Assistant:

void Assimp::ColladaParser::ReadEmbeddedTextures(ZipArchiveIOSystem& zip_archive)
{
    // Attempt to load any undefined Collada::Image in ImageLibrary
    for (ImageLibrary::iterator it = mImageLibrary.begin(); it != mImageLibrary.end(); ++it) {
        Collada::Image &image = (*it).second;

        if (image.mImageData.empty()) {
            std::unique_ptr<IOStream> image_file(zip_archive.Open(image.mFileName.c_str()));
            if (image_file) {
                image.mImageData.resize(image_file->FileSize());
                image_file->Read(image.mImageData.data(), image_file->FileSize(), 1);
                image.mEmbeddedFormat = BaseImporter::GetExtension(image.mFileName);
                if (image.mEmbeddedFormat == "jpeg") {
                    image.mEmbeddedFormat = "jpg";
                }
            }
        }
    }
}